

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O0

BlockRef * __thiscall
node::anon_unknown_2::MinerImpl::waitTipChanged
          (MinerImpl *this,uint256 current_tip,MillisecondsDouble timeout)

{
  long lVar1;
  partial_ordering pVar2;
  bool bVar3;
  KernelNotifications *pKVar4;
  CBlockIndex *pCVar5;
  BlockRef *in_RDI;
  long in_FS_OFFSET;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
  deadline;
  time_point now;
  MillisecondsDouble tick;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock44;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock;
  ChainstateManager *in_stack_fffffffffffffe98;
  unique_lock<std::mutex> *in_stack_fffffffffffffea0;
  CBlockIndex *in_stack_fffffffffffffea8;
  int *this_00;
  undefined8 in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  AnnotatedMixin<std::mutex> *in_stack_fffffffffffffed0;
  condition_variable *in_stack_fffffffffffffed8;
  byte local_fa;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::chrono::_V2::steady_clock::now();
  std::chrono::operator+
            ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)in_stack_fffffffffffffea0,
             (duration<double,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffe98);
  pVar2 = std::chrono::
          operator<=><std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
                      *)in_stack_fffffffffffffea0,
                     (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)in_stack_fffffffffffffe98);
  std::__cmp_cat::__unspec::__unspec((__unspec *)in_stack_fffffffffffffe98,(__unspec *)0x475f44);
  bVar3 = std::operator<(pVar2._M_value);
  if (bVar3) {
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::max();
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,std::chrono::duration<double,std::ratio<1l,1000000000l>>>
    ::time_point<std::chrono::duration<long,std::ratio<1l,1000000000l>>,void>
              ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffffea0,
               (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffffe98);
  }
  notifications((MinerImpl *)in_stack_fffffffffffffe98);
  MaybeCheckNotHeld((Mutex *)in_stack_fffffffffffffe98);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_fffffffffffffed8,
             in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
             (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x18,0));
  do {
    notifications((MinerImpl *)in_stack_fffffffffffffe98);
    uint256::uint256((uint256 *)in_stack_fffffffffffffe98);
    bVar3 = ::operator==((base_blob<256U> *)in_stack_fffffffffffffea8,
                         (base_blob<256U> *)in_stack_fffffffffffffea0);
    if (bVar3) {
LAB_0047607c:
      chainman((MinerImpl *)in_stack_fffffffffffffe98);
      bVar3 = util::SignalInterrupt::operator_cast_to_bool
                        ((SignalInterrupt *)in_stack_fffffffffffffe98);
      local_fa = bVar3 ^ 0xff;
    }
    else {
      notifications((MinerImpl *)in_stack_fffffffffffffe98);
      bVar3 = ::operator==((base_blob<256U> *)in_stack_fffffffffffffea8,
                           (base_blob<256U> *)in_stack_fffffffffffffea0);
      local_fa = 0;
      if (bVar3) goto LAB_0047607c;
    }
    if ((local_fa & 1) == 0) {
LAB_004761dc:
      UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_fffffffffffffe98);
      MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffe98);
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffed8,
                 (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffed0,
                 in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                 (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x18,0));
      chainman((MinerImpl *)in_stack_fffffffffffffe98);
      ChainstateManager::ActiveChain(in_stack_fffffffffffffe98);
      CChain::Tip((CChain *)in_stack_fffffffffffffea8);
      CBlockIndex::GetBlockHash(in_stack_fffffffffffffea8);
      this_00 = &in_RDI->height;
      chainman((MinerImpl *)in_stack_fffffffffffffe98);
      ChainstateManager::ActiveChain(in_stack_fffffffffffffe98);
      pCVar5 = CChain::Tip((CChain *)this_00);
      *this_00 = pCVar5->nHeight;
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffe98);
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return in_RDI;
    }
    std::chrono::_V2::steady_clock::now();
    pVar2 = std::chrono::
            operator<=><std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
                      ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)in_stack_fffffffffffffea0,
                       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
                        *)in_stack_fffffffffffffe98);
    std::__cmp_cat::__unspec::__unspec((__unspec *)in_stack_fffffffffffffe98,(__unspec *)0x476112);
    bVar3 = std::operator>=(pVar2._M_value);
    if (bVar3) goto LAB_004761dc;
    pKVar4 = notifications((MinerImpl *)in_stack_fffffffffffffe98);
    in_stack_fffffffffffffed8 = &pKVar4->m_tip_block_cv;
    std::chrono::operator+
              ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffffea0,
               (duration<double,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffe98);
    in_stack_fffffffffffffed0 =
         (AnnotatedMixin<std::mutex> *)
         std::
         min<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<double,std::ratio<1l,1000000000l>>>>
                   ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
                     *)in_stack_fffffffffffffea8,
                    (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
                     *)in_stack_fffffffffffffea0);
    std::condition_variable::wait_until<std::chrono::duration<double,std::ratio<1l,1000000000l>>>
              ((condition_variable *)in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
               (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffffe98);
  } while( true );
}

Assistant:

BlockRef waitTipChanged(uint256 current_tip, MillisecondsDouble timeout) override
    {
        // Interrupt check interval
        const MillisecondsDouble tick{1000};
        auto now{std::chrono::steady_clock::now()};
        auto deadline = now + timeout;
        // std::chrono does not check against overflow
        if (deadline < now) deadline = std::chrono::steady_clock::time_point::max();
        {
            WAIT_LOCK(notifications().m_tip_block_mutex, lock);
            while ((notifications().m_tip_block == uint256() || notifications().m_tip_block == current_tip) && !chainman().m_interrupt) {
                now = std::chrono::steady_clock::now();
                if (now >= deadline) break;
                notifications().m_tip_block_cv.wait_until(lock, std::min(deadline, now + tick));
            }
        }
        // Must release m_tip_block_mutex before locking cs_main, to avoid deadlocks.
        LOCK(::cs_main);
        return BlockRef{chainman().ActiveChain().Tip()->GetBlockHash(), chainman().ActiveChain().Tip()->nHeight};
    }